

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void bc_reader_free(BCReaderState *s)

{
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  JSAtom in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(uint *)(in_RDI + 0x24);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      JS_FreeAtom((JSContext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                  in_stack_ffffffffffffffec);
    }
    js_free((JSContext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
            (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  js_free((JSContext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
          (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

static void bc_reader_free(BCReaderState *s)
{
    int i;
    if (s->idx_to_atom) {
        for(i = 0; i < s->idx_to_atom_count; i++) {
            JS_FreeAtom(s->ctx, s->idx_to_atom[i]);
        }
        js_free(s->ctx, s->idx_to_atom);
    }
    js_free(s->ctx, s->objects);
}